

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

int __thiscall QTextDocumentPrivate::init(QTextDocumentPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  byte bVar2;
  long in_FS_OFFSET;
  bool undoState;
  QTextFormatCollection *pQVar3;
  int in_stack_ffffffffffffff98;
  QTextDocumentPrivate *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this->framesDirty = false;
  bVar2 = this->undoEnabled & 1;
  this->undoEnabled = false;
  pQVar3 = &this->formats;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x7d0769);
  iVar1 = QTextFormatCollection::indexForFormat
                    ((QTextFormatCollection *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),
                     (QTextFormat *)this);
  this->initialBlockCharFormatIndex = iVar1;
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d078d);
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0x7d079c);
  iVar1 = QTextFormatCollection::indexForFormat
                    ((QTextFormatCollection *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),
                     (QTextFormat *)this);
  this_00 = (QTextDocumentPrivate *)&stack0xffffffffffffffc8;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x7d07be);
  QTextFormatCollection::indexForFormat
            ((QTextFormatCollection *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),(QTextFormat *)this)
  ;
  insertBlock(this_00,iVar1,in_stack_ffffffffffffff98,(int)((ulong)pQVar3 >> 0x20),(Operation)pQVar3
             );
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d07ef);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7d07f9);
  this->undoEnabled = (bool)(bVar2 & 1);
  this->modified = false;
  this->modifiedState = 0;
  qRegisterMetaType<QTextDocument*>();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::init()
{
    framesDirty = false;

    bool undoState = undoEnabled;
    undoEnabled = false;
    initialBlockCharFormatIndex = formats.indexForFormat(QTextCharFormat());
    insertBlock(0, formats.indexForFormat(QTextBlockFormat()), formats.indexForFormat(QTextCharFormat()));
    undoEnabled = undoState;
    modified = false;
    modifiedState = 0;

    qRegisterMetaType<QTextDocument *>();
}